

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

void caffe::UpgradeNetBatchNorm(NetParameter *net_param)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  int iVar1;
  Type *pTVar2;
  Type *pTVar3;
  int index;
  
  if (0 < (net_param->layer_).super_RepeatedPtrFieldBase.current_size_) {
    this = &net_param->layer_;
    index = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,index);
      iVar1 = std::__cxx11::string::compare((char *)(pTVar2->type_).ptr_);
      if (((iVar1 == 0) &&
          (pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,index),
          (pTVar2->param_).super_RepeatedPtrFieldBase.current_size_ == 3)) &&
         (pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,index),
         0 < (pTVar2->param_).super_RepeatedPtrFieldBase.current_size_)) {
        iVar1 = 0;
        do {
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,index);
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                             (&(pTVar2->param_).super_RepeatedPtrFieldBase,iVar1);
          *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 0xc;
          pTVar3->lr_mult_ = 0.0;
          pTVar3->decay_mult_ = 0.0;
          iVar1 = iVar1 + 1;
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,index);
        } while (iVar1 < (pTVar2->param_).super_RepeatedPtrFieldBase.current_size_);
      }
      index = index + 1;
    } while (index < (net_param->layer_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

void UpgradeNetBatchNorm(NetParameter* net_param) {
  for (int i = 0; i < net_param->layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param->layer(i).type() == "BatchNorm"
        && net_param->layer(i).param_size() == 3) {
      // set lr_mult and decay_mult to zero. leave all other param intact.
      for (int ip = 0; ip < net_param->layer(i).param_size(); ip++) {
        ParamSpec* fixed_param_spec =
          net_param->mutable_layer(i)->mutable_param(ip);
        fixed_param_spec->set_lr_mult(0.f);
        fixed_param_spec->set_decay_mult(0.f);
      }
    }
  }
}